

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessing.c
# Opt level: O3

token * preproc_find_else(Source_File *src,Translation_Data *translation_data,char jump_before)

{
  token *__ptr;
  long lVar1;
  int iVar2;
  Source_File *pSVar3;
  undefined8 *puVar4;
  byte bVar5;
  Source_File temp_src;
  undefined8 local_98 [13];
  
  bVar5 = 0;
  pSVar3 = src;
  puVar4 = local_98;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar4 = pSVar3->src_name;
    pSVar3 = (Source_File *)&pSVar3->src;
    puVar4 = puVar4 + 1;
  }
  if (src->src[src->where_in_src] != '\0') {
    iVar2 = 1;
    do {
      pSVar3 = src;
      puVar4 = local_98;
      for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
        *puVar4 = pSVar3->src_name;
        pSVar3 = (Source_File *)((long)pSVar3 + (ulong)bVar5 * -0x10 + 8);
        puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
      }
      __ptr = get_next_token(src,chonky,'\x01');
      if (__ptr->type == KW_HASHTAG) {
        free(__ptr);
        __ptr = get_next_token(src,chonky_jr,'\0');
        switch(__ptr->type) {
        case PKW_IF:
        case PKW_IFDEF:
        case PKW_IFNDEF:
          iVar2 = iVar2 + 1;
          break;
        case PKW_ELIF:
        case PKW_ELSE:
          if (iVar2 == 1) {
            if (jump_before != '\0') {
              puVar4 = local_98;
              for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
                src->src_name = (Source_Name *)*puVar4;
                puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
                src = (Source_File *)((long)src + (ulong)bVar5 * -0x10 + 8);
              }
              return __ptr;
            }
            return __ptr;
          }
          break;
        case PKW_ENDIF:
          iVar2 = iVar2 + -1;
          break;
        case PKW_NOTYPE:
          free(__ptr);
          goto_new_line(src,translation_data);
          return (token *)0x0;
        }
      }
      else if (__ptr->type == KW_NOTYPE) {
        if (src->where_in_src != src->src_size) {
          push_lexing_error("unexpected character",src,translation_data);
        }
        free(__ptr);
        return (token *)0x0;
      }
      free(__ptr);
      goto_new_line(src,translation_data);
    } while ((src->src[src->where_in_src] != '\0') && (iVar2 != 0));
  }
  if (jump_before != '\0') {
    puVar4 = local_98;
    for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
      src->src_name = (Source_Name *)*puVar4;
      puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
      src = (Source_File *)((long)src + (ulong)bVar5 * -0x10 + 8);
    }
  }
  return (token *)0x0;
}

Assistant:

struct token* preproc_find_else(struct Source_File *src,struct Translation_Data *translation_data,char jump_before)
{
	struct token *hold_token;
	struct Source_File temp_src;
	int indentation=1;

		temp_src=*src;
	while(src->src[src->where_in_src]!='\0' && indentation)
	{
		/*BEWARE*/
		temp_src=*src;
		/*END BEWARE*/

		hold_token=get_next_token(src,&chonky[0],1);
		if(hold_token->type==KW_HASHTAG)
		{
			free(hold_token);
			hold_token=get_next_token(src,&chonky_jr[0],0);
			switch(hold_token->type)
			{
				case PKW_IF:
				case PKW_IFDEF:
				case PKW_IFNDEF:
					++indentation;
					break;

				case PKW_ENDIF:
					--indentation;
					break;

				case PKW_ELSE:
				case PKW_ELIF:
					if(indentation==1)
					{
						if(jump_before)
							*src=temp_src;
						return hold_token;
					}
					else
					{
						break;
					}
				case PKW_NOTYPE:
					free(hold_token);
					goto_new_line(src,translation_data);
					return NULL;
			}
			free(hold_token);

		}else if(hold_token->type!=KW_NOTYPE)
		{
			free(hold_token);
		}else
		{
			if(src->where_in_src!=src->src_size)
				push_lexing_error("unexpected character",src,translation_data);
			free(hold_token);
			return NULL;
		}
		goto_new_line(src,translation_data);
	}
	/*BEWARE*/
	//goto_new_line(src,translation_data);	
	/*END BEWARE*/
	if(jump_before)
		*src=temp_src;
	return NULL;
}